

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonAppendObjectPathElement(JsonString *pStr,JsonNode *pNode)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  JsonNode *pJVar5;
  bool bVar6;
  
  pJVar5 = (pNode->u).pPatch;
  uVar1 = pNode->n;
  uVar3 = (ulong)uVar1;
  if ((2 < (int)uVar1) && ((""[pJVar5->jnFlags] & 2) != 0)) {
    uVar2 = uVar1 - 1;
    uVar3 = 2;
    while ((uVar4 = (ulong)uVar2, uVar2 != uVar3 &&
           (uVar4 = uVar3, (""[(&pJVar5->eType)[uVar3]] & 6) != 0))) {
      uVar3 = uVar3 + 1;
    }
    bVar6 = (uint)uVar4 != uVar2;
    uVar2 = uVar1 - 2;
    if (bVar6) {
      uVar2 = uVar1;
    }
    uVar3 = (ulong)uVar2;
    if (!bVar6) {
      pJVar5 = (JsonNode *)&pJVar5->jnFlags;
    }
  }
  jsonPrintf((int)uVar3 + 2,pStr,".%.*s",uVar3,pJVar5);
  return;
}

Assistant:

static void jsonAppendObjectPathElement(
  JsonString *pStr,
  JsonNode *pNode
){
  int jj, nn;
  const char *z;
  assert( pNode->eType==JSON_STRING );
  assert( pNode->jnFlags & JNODE_LABEL );
  assert( pNode->eU==1 );
  z = pNode->u.zJContent;
  nn = pNode->n;
  assert( nn>=2 );
  assert( z[0]=='"' );
  assert( z[nn-1]=='"' );
  if( nn>2 && sqlite3Isalpha(z[1]) ){
    for(jj=2; jj<nn-1 && sqlite3Isalnum(z[jj]); jj++){}
    if( jj==nn-1 ){
      z++;
      nn -= 2;
    }
  }
  jsonPrintf(nn+2, pStr, ".%.*s", nn, z);
}